

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall ON_3dmObjectAttributes::Write(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ON_DisplayMaterialRef *uuid;
  bool local_7d;
  ON__INT32 local_7c;
  byte local_69;
  bool local_51;
  ON_DisplayMaterialRef *dmr;
  int i_1;
  bool bAddPagespaceDMR;
  int count_local;
  uchar uc;
  int i;
  int count;
  short s;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_3dmObjectAttributes *this_local;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar2 < 5) {
    i._3_1_ = ON_BinaryArchive::Write3dmChunkVersion(file,1,8);
    if (i._3_1_) {
      i._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_uuid);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,Layer,this->m_layer_index);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::Write3dmReferencedComponentIndex
                          (file,Material,this->m_material_index);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteColor(file,&this->m_color);
    }
    if (i._3_1_ != false) {
      if (i._3_1_ != false) {
        i._3_1_ = ON_BinaryArchive::WriteShort(file,(ON__INT16)this->m_object_decoration);
      }
      if (i._3_1_ != false) {
        i._3_1_ = ON_BinaryArchive::WriteShort(file,0);
      }
      if (i._3_1_ != false) {
        i._3_1_ = ON_BinaryArchive::WriteDouble(file,0.0);
      }
      if (i._3_1_ != false) {
        i._3_1_ = ON_BinaryArchive::WriteDouble(file,1.0);
      }
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteInt(file,this->m_wire_density);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_mode);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_color_source);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_linetype_source);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_material_source);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteString(file,&this->m_name);
    }
    if (i._3_1_ != false) {
      ON_BinaryArchive::WriteString(file,&this->m_url);
    }
    iVar2 = ON_SimpleArray<int>::Count(&this->m_group);
    i._3_1_ = ON_BinaryArchive::WriteInt(file,iVar2);
    count_local = 0;
    while( true ) {
      local_51 = false;
      if (count_local < iVar2) {
        local_51 = i._3_1_;
      }
      if (local_51 == false) break;
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_group,count_local);
      i._3_1_ = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,Group,*piVar3);
      count_local = count_local + 1;
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bVisible & 1));
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteArray(file,&this->m_dmref);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteInt(file,this->m_object_decoration);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_plot_color_source);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteColor(file,&this->m_plot_color);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_plot_weight_source);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::WriteDouble(file,this->m_plot_weight_mm);
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_BinaryArchive::Write3dmReferencedComponentIndex
                          (file,LinePattern,this->m_linetype_index);
    }
    if (i._3_1_ != false) {
      bAddPagespaceDMR = false;
      switch(this->m_space) {
      case no_space:
        bAddPagespaceDMR = false;
        break;
      case model_space:
        bAddPagespaceDMR = false;
        break;
      case page_space:
        bAddPagespaceDMR = true;
        break;
      case uveditor_space:
      case blockeditor_space:
        bAddPagespaceDMR = true;
        ON_REMOVE_ASAP_AssertEx
                  (0,
                   "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                   ,0x623,"","false is false");
      }
      i._3_1_ = ON_BinaryArchive::WriteChar(file,bAddPagespaceDMR);
    }
    if (i._3_1_ != false) {
      i_1 = ON_SimpleArray<ON_DisplayMaterialRef>::Count(&this->m_dmref);
      if (i_1 < 0) {
        i_1 = 0;
      }
      local_69 = 0;
      if (this->m_space == page_space) {
        bVar1 = ON_UuidIsNil(&this->m_viewport_id);
        local_69 = bVar1 ^ 0xff;
      }
      if ((local_69 & 1) == 0) {
        local_7c = i_1;
      }
      else {
        local_7c = i_1 + 1;
      }
      i._3_1_ = ON_BinaryArchive::WriteInt(file,local_7c);
      if (((i._3_1_) && ((local_69 & 1) != 0)) &&
         (i._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_viewport_id), i._3_1_)) {
        i._3_1_ = ON_BinaryArchive::WriteUuid(file,&ON_ObsoletePageSpaceObjectId);
      }
      dmr._4_4_ = 0;
      while( true ) {
        local_7d = false;
        if (dmr._4_4_ < i_1) {
          local_7d = i._3_1_;
        }
        if (local_7d == false) break;
        uuid = ON_SimpleArray<ON_DisplayMaterialRef>::operator[](&this->m_dmref,dmr._4_4_);
        i._3_1_ = ON_BinaryArchive::WriteUuid(file,&uuid->m_viewport_id);
        if (i._3_1_) {
          i._3_1_ = ON_BinaryArchive::WriteUuid(file,&uuid->m_display_material_id);
        }
        dmr._4_4_ = dmr._4_4_ + 1;
      }
    }
    if (i._3_1_ != false) {
      i._3_1_ = ON_ObjectRenderingAttributes::Write(&this->m_rendering_attributes,file);
    }
    this_local._7_1_ = i._3_1_;
  }
  else {
    this_local._7_1_ = Internal_WriteV5(this,file);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmObjectAttributes::Write( ON_BinaryArchive& file ) const
{
  if ( file.Archive3dmVersion() >= 5 )
  {
    // added at opennurbs version 200712190
    return Internal_WriteV5(file);
  }

  bool rc = file.Write3dmChunkVersion(1,8);
  // version 1.0 fields
  if (rc) rc = file.WriteUuid(m_uuid);
  if (rc) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::Layer, m_layer_index);
  if (rc) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderMaterial, m_material_index);
  if (rc) rc = file.WriteColor(m_color);

  if (rc)
  {
    // OBSOLETE if (rc) rc = file.WriteLineStyle(m_line_style); // 23 March 2005 Dale Lear
    short s;
    s = (short)m_object_decoration;
    if (rc) rc = file.WriteShort(s);
    s = 0;
    if (rc) rc = file.WriteShort(s);
    if (rc) rc = file.WriteDouble(0.0);
    if (rc) rc = file.WriteDouble(1.0);
  }

  if (rc) rc = file.WriteInt(m_wire_density);
  if (rc) rc = file.WriteChar(m_mode);
  if (rc) rc = file.WriteChar(m_color_source);
  if (rc) rc = file.WriteChar(m_linetype_source);
  if (rc) rc = file.WriteChar(m_material_source);
  if (rc) rc = file.WriteString(m_name);
  if (rc) rc = file.WriteString(m_url);

  // version 1.1 fields
  int count = m_group.Count();
  rc = file.WriteInt(count);
  for ( int i = 0; i < count && rc; i++)
    rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::Group, m_group[i]);

  // version 1.2 fields
  if (rc) rc = file.WriteBool(m_bVisible);

  // version 1.3 fields
  if (rc) rc = file.WriteArray(m_dmref);

  // version 1.4 fields - 23 March 2005 Dale Lear
  if (rc) rc = file.WriteInt(m_object_decoration);
  if (rc) rc = file.WriteChar(m_plot_color_source);
  if (rc) rc = file.WriteColor(m_plot_color);
  if (rc) rc = file.WriteChar(m_plot_weight_source);
  if (rc) rc = file.WriteDouble(m_plot_weight_mm);

  // version 1.5 fields 11 April 2005
  if (rc) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, m_linetype_index );

  // version 1.6 fields 2 September 2005
  if (rc)
  {
    unsigned char uc = 0;
    switch(m_space)
    {
    case ON::no_space:    uc = 0; break;
    case ON::model_space: uc = 0; break;
    case ON::page_space:  uc = 1; break;
    case ON::uveditor_space:
    case ON::blockeditor_space:
        {
            uc = 2;
            ON_ASSERT(false);
            break;
        }
    }
    rc = file.WriteChar(uc);
  }
  if (rc)
  {
    // 22 Sep 2006 - the way ON_3dmObjectAttributes indicates
    // that an object is put on a particular page view changed
    // from being saved in the m_dmref[] list to using the
    // m_space and m_viewport_id settings.  But the file format
    // cannot change at this point.  So, the bAddPagespaceDMR
    // is here to save the page info in the old dmr format.
    int count_local = m_dmref.Count();
    if ( count_local < 0 )
      count_local = 0;
    bool bAddPagespaceDMR = ( ON::page_space == m_space && !ON_UuidIsNil(m_viewport_id) );
    rc = file.WriteInt( bAddPagespaceDMR ? (count_local+1) : count_local );
    if ( rc && bAddPagespaceDMR )
    {
      rc = file.WriteUuid(m_viewport_id);
      if (rc) rc = file.WriteUuid(ON_ObsoletePageSpaceObjectId);
    }
    int i;
    for ( i = 0; i < count_local && rc; i++ )
    {
      const ON_DisplayMaterialRef& dmr = m_dmref[i];
      rc = file.WriteUuid(dmr.m_viewport_id);
      if (rc) rc = file.WriteUuid(dmr.m_display_material_id);
    }
  }

  // version 1.7 fields 6 June 2006
  if (rc) rc = m_rendering_attributes.Write(file);

  return rc;
}